

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

U32 ZSTD_rawLiteralsCost(BYTE *literals,U32 litLength,optState_t *optPtr,int optLevel)

{
  uint uVar1;
  U32 UVar2;
  uint uVar3;
  uint uVar4;
  undefined4 in_register_00000034;
  long *plVar5;
  
  plVar5 = (long *)CONCAT44(in_register_00000034,litLength);
  UVar2 = 0x800;
  if (((int)plVar5[0xc] != 2) && (UVar2 = 0x600, (int)plVar5[10] != 1)) {
    uVar1 = *(uint *)(plVar5 + 8);
    if (uVar1 < 0x100) {
      __assert_fail("optPtr->litSumBasePrice >= BITCOST_MULTIPLIER",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x803b,
                    "U32 ZSTD_rawLiteralsCost(const BYTE *const, const U32, const optState_t *const, int)"
                   );
    }
    uVar3 = *(int *)(*plVar5 + (ulong)*literals * 4) + 1;
    uVar4 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    if ((int)optPtr == 0) {
      uVar4 = uVar4 << 8;
    }
    else {
      if (0x16 < uVar4) {
        __assert_fail("hb + BITCOST_ACCURACY < 31",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x7f60,"U32 ZSTD_fracWeight(U32)");
      }
      uVar4 = (uVar3 * 0x100 >> ((byte)uVar4 & 0x1f)) + uVar4 * 0x100;
    }
    if (uVar1 - 0x100 < uVar4) {
      uVar4 = uVar1 - 0x100;
    }
    UVar2 = uVar1 - uVar4;
  }
  return UVar2;
}

Assistant:

static U32 ZSTD_rawLiteralsCost(const BYTE* const literals, U32 const litLength,
                                const optState_t* const optPtr,
                                int optLevel)
{
    if (litLength == 0) return 0;

    if (!ZSTD_compressedLiterals(optPtr))
        return (litLength << 3) * BITCOST_MULTIPLIER;  /* Uncompressed - 8 bytes per literal. */

    if (optPtr->priceType == zop_predef)
        return (litLength*6) * BITCOST_MULTIPLIER;  /* 6 bit per literal - no statistic used */

    /* dynamic statistics */
    {   U32 price = optPtr->litSumBasePrice * litLength;
        U32 const litPriceMax = optPtr->litSumBasePrice - BITCOST_MULTIPLIER;
        U32 u;
        assert(optPtr->litSumBasePrice >= BITCOST_MULTIPLIER);
        for (u=0; u < litLength; u++) {
            U32 litPrice = WEIGHT(optPtr->litFreq[literals[u]], optLevel);
            if (UNLIKELY(litPrice > litPriceMax)) litPrice = litPriceMax;
            price -= litPrice;
        }
        return price;
    }
}